

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nsync_semaphore_futex.c
# Opt level: O0

int __thiscall
nsync::nsync_mu_semaphore_p_with_deadline(nsync *this,nsync_semaphore *s,nsync_time abs_deadline)

{
  nsync_time a;
  nsync_time a_00;
  uint o;
  int iVar1;
  int *piVar2;
  __syscall_slong_t _Var3;
  bool bVar4;
  nsync_time nVar5;
  timespec *local_50;
  timespec *ts;
  timespec ts_buf;
  int local_30;
  int futex_result;
  int result;
  int i;
  futex *f;
  nsync_semaphore *s_local;
  nsync_time abs_deadline_local;
  
  _Var3 = abs_deadline.tv_sec;
  local_30 = 0;
  do {
    o = std::atomic_load_explicit<unsigned_int>((atomic<unsigned_int> *)this,memory_order_relaxed);
    if (o == 0) {
      local_50 = (timespec *)0x0;
      a_00.tv_nsec = _Var3;
      a_00.tv_sec = (__time_t)s;
      nVar5.tv_nsec = 999999999;
      nVar5.tv_sec = 0x7fffffffffffffff;
      iVar1 = nsync_time_cmp(a_00,nVar5);
      if (iVar1 != 0) {
        memset(&ts,0,0x10);
        local_50 = (timespec *)&ts;
        ts = (timespec *)s;
        ts_buf.tv_sec = _Var3;
      }
      ts_buf.tv_nsec._4_4_ = futex((int *)this,0x189,0,local_50,(int *)0x0,-1);
      if ((((ts_buf.tv_nsec._4_4_ != 0) && (piVar2 = __errno_location(), *piVar2 != 4)) &&
          (piVar2 = __errno_location(), *piVar2 != 0xb)) &&
         (piVar2 = __errno_location(), *piVar2 != 0x6e)) {
        uRam0000000000000000 = 0;
      }
      bVar4 = false;
      if (ts_buf.tv_nsec._4_4_ == -1) {
        piVar2 = __errno_location();
        bVar4 = false;
        if (*piVar2 == 0x6e) {
          nVar5 = nsync_time_now();
          a.tv_nsec = _Var3;
          a.tv_sec = (__time_t)s;
          iVar1 = nsync_time_cmp(a,nVar5);
          bVar4 = iVar1 < 1;
        }
      }
      if (bVar4) {
        local_30 = 0x6e;
      }
    }
    bVar4 = false;
    if ((local_30 == 0) && (bVar4 = true, o != 0)) {
      iVar1 = atm_cas_acq_u32_((nsync_atomic_uint32_ *)this,o,o - 1);
      bVar4 = iVar1 == 0;
    }
  } while (bVar4);
  return local_30;
}

Assistant:

int nsync_mu_semaphore_p_with_deadline (nsync_semaphore *s, nsync_time abs_deadline) {
	struct futex *f = (struct futex *)s;
	int i;
	int result = 0;
	do {
		i = ATM_LOAD ((nsync_atomic_uint32_ *) &f->i);
		if (i == 0) {
			int futex_result;
			struct timespec ts_buf;
			const struct timespec *ts = NULL;
			if (nsync_time_cmp (abs_deadline, nsync_time_no_deadline) != 0) {
				memset (&ts_buf, 0, sizeof (ts_buf));
				if (FUTEX_TIMEOUT_IS_ABSOLUTE) {
					ts_buf.tv_sec = NSYNC_TIME_SEC (abs_deadline);
					ts_buf.tv_nsec = NSYNC_TIME_NSEC (abs_deadline);
				} else {
					nsync_time now;
					now = nsync_time_now ();
					if (nsync_time_cmp (now, abs_deadline) > 0) {
						ts_buf.tv_sec = 0;
						ts_buf.tv_nsec = 0;
					} else {
						nsync_time rel_deadline;
						rel_deadline = nsync_time_sub (abs_deadline, now);
						ts_buf.tv_sec = NSYNC_TIME_SEC (rel_deadline);
						ts_buf.tv_nsec = NSYNC_TIME_NSEC (rel_deadline);
					}
				}
				ts = &ts_buf;
			}
			futex_result = futex (&f->i, FUTEX_WAIT_, i, ts, NULL, FUTEX_WAIT_BITS_);
			ASSERT (futex_result == 0 || errno == EINTR || errno == EWOULDBLOCK ||
				errno == ETIMEDOUT);
			/* Some systems don't wait as long as they are told. */ 
			if (futex_result == -1 && errno == ETIMEDOUT &&
			    nsync_time_cmp (abs_deadline, nsync_time_now ()) <= 0) {
				result = ETIMEDOUT;
			}
		}
	} while (result == 0 && (i == 0 || !ATM_CAS_ACQ ((nsync_atomic_uint32_ *) &f->i, i, i - 1)));
	return (result);
}